

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::FinalizeAllObjects
          (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_class_16_2_093ebf5c fn;
  anon_class_16_2_093ebf5c_for_fn fn_00;
  uint local_1c [2];
  uint processedCount;
  
  if (this->finalizeCount != 0) {
    local_1c[0] = 0;
    fn_00.processedCount = local_1c;
    fn_00.this = this;
    SmallHeapBlockT<SmallAllocationBlockAttributes>::
    ForEachAllocatedObject<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::FinalizeAllObjects()::_lambda(unsigned_int,void*)_1_>
              ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this,FinalizeBit,fn_00);
    fn.processedCount = local_1c;
    fn.this = this;
    ForEachPendingDisposeObject<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::FinalizeAllObjects()::_lambda(unsigned_int)_1_>
              (this,fn);
    if (local_1c[0] != this->finalizeCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x24f,"(this->finalizeCount == processedCount)",
                         "this->finalizeCount == processedCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void
SmallFinalizableHeapBlockT<TBlockAttributes>::FinalizeAllObjects()
{
    if (this->finalizeCount != 0)
    {
        DebugOnly(uint processedCount = 0);
        this->ForEachAllocatedObject(FinalizeBit, [&](uint index, void * objectAddress)
        {
            FinalizableObject * finalizableObject = ((FinalizableObject *)objectAddress);

            finalizableObject->Finalize(true);
            finalizableObject->Dispose(true);
#ifdef RECYCLER_FINALIZE_CHECK
            this->heapBucket->heapInfo->liveFinalizableObjectCount --;
#endif
            DebugOnly(processedCount++);
        });

        this->ForEachPendingDisposeObject([&] (uint index) {
            void * objectAddress = this->address + (this->objectSize * index);
            ((FinalizableObject *)objectAddress)->Dispose(true);
#ifdef RECYCLER_FINALIZE_CHECK
            this->heapBucket->heapInfo->liveFinalizableObjectCount--;
            this->heapBucket->heapInfo->pendingDisposableObjectCount--;
#endif
            DebugOnly(processedCount++);
        });

        Assert(this->finalizeCount == processedCount);
    }
}